

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detour_test.cpp
# Opt level: O0

void __thiscall
detour_test_DefaultConstructor_Test::TestBody(detour_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  detour d;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  detour_handle_type **in_stack_fffffffffffffdc0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffe14;
  int x;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_160;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined4 local_138;
  undefined4 local_134;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  int local_110;
  undefined4 local_10c;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  detour_handle local_e8;
  undefined8 local_e0;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  int local_b8;
  undefined4 local_b4;
  AssertionResult local_b0;
  AssertHelper local_a0;
  Message local_98;
  undefined8 local_90;
  undefined8 local_88;
  AssertionResult local_80;
  undefined8 local_70;
  AssertHelper local_68;
  Message local_60;
  undefined4 local_58;
  undefined4 local_54;
  AssertionResult local_50;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  uVar2 = log_policy_format_text();
  uVar3 = log_policy_schedule_sync();
  uVar4 = log_policy_storage_sequential();
  uVar5 = log_policy_stream_stdio(_stdout);
  local_20 = log_configure_impl("metacall",4,uVar2,uVar3,uVar4,uVar5);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (int *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
             (int *)in_stack_fffffffffffffdc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10bde5);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x45,pcVar6);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10be48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10be9d);
  local_54 = 0;
  local_58 = detour_initialize();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (int *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
             (int *)in_stack_fffffffffffffdc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10bf56);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x48,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message((Message *)0x10bfb9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c011);
  local_90 = detour_create("funchook");
  local_88 = 0;
  local_70 = local_90;
  testing::internal::CmpHelperNE<plugin_type*,plugin_type*>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (plugin_type **)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
             (plugin_type **)in_stack_fffffffffffffdc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c0e3);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x4d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message((Message *)0x10c140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c198);
  local_b4 = 0;
  pcVar6 = (char *)detour_name(local_70);
  local_b8 = strcmp("funchook",pcVar6);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (int *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
             (int *)in_stack_fffffffffffffdc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c25c);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x4f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x10c2b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c311);
  handle = (detour_handle)detour_install(local_70,target_function,hook_function);
  local_e0 = 0;
  local_e8 = handle;
  testing::internal::CmpHelperNE<detour_handle_type*,detour_handle_type*>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (detour_handle_type **)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
             in_stack_fffffffffffffdc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  x = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe14);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c3e4);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x54,pcVar6);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message((Message *)0x10c441);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c496);
  local_10c = 0x84;
  local_110 = target_function(x);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (int *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
             (int *)in_stack_fffffffffffffdc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c548);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x57,pcVar6);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x10c5a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c5fd);
  local_134 = 0;
  local_138 = detour_uninstall(local_70,handle);
  this_01 = &local_130;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_fffffffffffffdd0,
             (int *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
             (int *)in_stack_fffffffffffffdc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    in_stack_fffffffffffffdd0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10c6b9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x5a,in_stack_fffffffffffffdd0);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message((Message *)0x10c716);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c76b);
  local_15c = 0;
  local_160 = detour_clear(local_70);
  this_00 = &local_158;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_fffffffffffffdd0,
             (int *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x10c820);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/detour_test/source/detour_test.cpp"
               ,0x5d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message((Message *)0x10c87b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c8d0);
  detour_destroy();
  return;
}

Assistant:

TEST_F(detour_test, DefaultConstructor)
{
	static const char name[] = "funchook";

	/* Initialize log */
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	/* Initialize detour */
	EXPECT_EQ((int)0, (int)detour_initialize());

	/* Create detour funchook */
	detour d = detour_create(name);

	EXPECT_NE((detour)NULL, (detour)d);

	EXPECT_EQ((int)0, (int)strcmp(name, detour_name(d)));

	/* Install detour */
	handle = detour_install(d, (void (*)(void)) & target_function, (void (*)(void)) & hook_function);

	EXPECT_NE((detour_handle)NULL, (detour_handle)handle);

	/* Call detour, it should call hooked function */
	EXPECT_EQ((int)132, (int)target_function(128));

	/* Uninstall detour */
	EXPECT_EQ((int)0, (int)detour_uninstall(d, handle));

	/* Clear detour */
	EXPECT_EQ((int)0, (int)detour_clear(d));

	/* Destroy detour */
	detour_destroy();
}